

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O1

_Bool rcnb_decode_byte(wchar_t *value_in,char **value_out)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  unsigned_short *puVar8;
  
  uVar4 = 0xffffffff;
  lVar7 = 0x3c;
  lVar5 = 0;
  do {
    if (L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[lVar5] == *value_in) goto LAB_001016f2;
    lVar5 = lVar5 + 1;
    lVar7 = lVar7 + -4;
  } while (lVar7 != 0);
  lVar5 = 0xffffffff;
LAB_001016f2:
  uVar3 = (uint)lVar5;
  puVar8 = &sc;
  lVar7 = 0x3c;
  lVar5 = 0;
  do {
    if (L"cCĆćĈĉĊċČčƇƈÇȻȼ"[lVar5] == value_in[1]) {
      uVar4 = (uint)lVar5;
      break;
    }
    lVar5 = lVar5 + 1;
    lVar7 = lVar7 + -4;
  } while (lVar7 != 0);
  uVar6 = uVar3 | uVar4;
  if ((int)uVar6 < 0) {
    uVar4 = 0xffffffff;
    lVar7 = 0x3c;
    lVar5 = 0;
    do {
      if (L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[lVar5] == *value_in) goto LAB_00101767;
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + -4;
    } while (lVar7 != 0);
    lVar5 = 0xffffffff;
LAB_00101767:
    uVar3 = (uint)lVar5;
    lVar5 = 0x28;
    lVar7 = 0;
    do {
      if (L"bBƀƁƃƄƅßÞþ"[lVar7] == value_in[1]) {
        uVar4 = (uint)lVar7;
        break;
      }
      lVar7 = lVar7 + 1;
      lVar5 = lVar5 + -4;
    } while (lVar5 != 0);
  }
  bVar2 = false;
  if ((-1 < (int)uVar3) && (bVar2 = false, -1 < (int)uVar4)) {
    if ((int)uVar6 < 0) {
      puVar8 = &sb;
    }
    uVar4 = uVar3 * *puVar8 + uVar4;
    bVar2 = (int)uVar4 < 0x80;
    if ((int)uVar4 < 0x80) {
      uVar3 = (uint)(byte)((byte)uVar4 | 0x80);
      if (-1 < (int)uVar6) {
        uVar3 = uVar4;
      }
      pcVar1 = *value_out;
      *value_out = pcVar1 + 1;
      *pcVar1 = (char)uVar3;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool rcnb_decode_byte(const wchar_t* value_in, char** value_out)
{
    bool nb = false;
    int idx[2] = { find(cr, sr, *value_in), find(cc, sc, *(value_in + 1)) };
    if (idx[0] < 0 || idx[1] < 0) {
        idx[0] = find(cn, sn, *value_in);
        idx[1] = find(cb, sb, *(value_in + 1));
        nb = true;
    }
    if (idx[0] < 0 || idx[1] < 0)
        return false;
    int result = nb ? idx[0] * sb + idx[1] : idx[0] * sc + idx[1];
    if (result > 0x7F)
        return false;
    *(*value_out)++ = (char)(nb ? result | 0x80 : result);
    return true;
}